

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa_asn1.cc
# Opt level: O3

DSA * d2i_DSAparams(DSA **a,uchar **pp,long length)

{
  DSA *pDVar1;
  CBS cbs;
  CBS local_28;
  
  if (length < 0) {
    pDVar1 = (DSA *)0x0;
  }
  else {
    local_28.data = *pp;
    local_28.len = length;
    pDVar1 = (DSA *)DSA_parse_parameters(&local_28);
    if (pDVar1 != (DSA *)0x0) {
      if (a != (DSA **)0x0) {
        DSA_free(*a);
        *a = pDVar1;
      }
      *pp = local_28.data;
    }
  }
  return pDVar1;
}

Assistant:

DSA *d2i_DSAparams(DSA **out, const uint8_t **inp, long len) {
  if (len < 0) {
    return NULL;
  }
  CBS cbs;
  CBS_init(&cbs, *inp, (size_t)len);
  DSA *ret = DSA_parse_parameters(&cbs);
  if (ret == NULL) {
    return NULL;
  }
  if (out != NULL) {
    DSA_free(*out);
    *out = ret;
  }
  *inp = CBS_data(&cbs);
  return ret;
}